

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O1

NodePtr __thiscall avro::makePrimitive(avro *this,string *t)

{
  int iVar1;
  NodePrimitive *p;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar2;
  NodePtr NVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)t);
  if (iVar1 == 0) {
    p = (NodePrimitive *)operator_new(0x18);
    (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_NULL;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)t);
    if (iVar1 == 0) {
      p = (NodePrimitive *)operator_new(0x18);
      (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_BOOL;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)t);
      if (iVar1 == 0) {
        p = (NodePrimitive *)operator_new(0x18);
        (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_INT;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)t);
        if (iVar1 == 0) {
          p = (NodePrimitive *)operator_new(0x18);
          (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_LONG;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)t);
          if (iVar1 == 0) {
            p = (NodePrimitive *)operator_new(0x18);
            (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_FLOAT;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)t);
            if (iVar1 == 0) {
              p = (NodePrimitive *)operator_new(0x18);
              (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_DOUBLE;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)t);
              if (iVar1 == 0) {
                p = (NodePrimitive *)operator_new(0x18);
                (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_STRING;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)t);
                if (iVar1 != 0) {
                  *(undefined8 *)this = 0;
                  *(undefined8 *)(this + 8) = 0;
                  sVar2.pi_ = extraout_RDX;
                  goto LAB_00172c51;
                }
                p = (NodePrimitive *)operator_new(0x18);
                (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_BYTES;
              }
            }
          }
        }
      }
    }
  }
  (p->super_NodeImplPrimitive).super_Node.locked_ = false;
  (p->super_NodeImplPrimitive).super_Node._vptr_Node = (_func_int **)&PTR__Node_001ce950;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>((shared_ptr<avro::Node> *)this,p);
  sVar2.pi_ = extraout_RDX_00;
LAB_00172c51:
  NVar3.pn.pi_ = sVar2.pi_;
  NVar3.px = (element_type *)this;
  return NVar3;
}

Assistant:

static NodePtr makePrimitive(const std::string& t)
{
    if (t == "null") {
        return NodePtr(new NodePrimitive(AVRO_NULL));
    } else if (t == "boolean") {
        return NodePtr(new NodePrimitive(AVRO_BOOL));
    } else if (t == "int") {
        return NodePtr(new NodePrimitive(AVRO_INT));
    } else if (t == "long") {
        return NodePtr(new NodePrimitive(AVRO_LONG));
    } else if (t == "float") {
        return NodePtr(new NodePrimitive(AVRO_FLOAT));
    } else if (t == "double") {
        return NodePtr(new NodePrimitive(AVRO_DOUBLE));
    } else if (t == "string") {
        return NodePtr(new NodePrimitive(AVRO_STRING));
    } else if (t == "bytes") {
        return NodePtr(new NodePrimitive(AVRO_BYTES));
    } else {
        return NodePtr();
    }
}